

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

char * CVmObjBigNum::cache_e(size_t prec)

{
  ushort *dst;
  CVmBigNumCache *pCVar1;
  int iVar2;
  uint16_t tmp;
  ulong uVar3;
  
  pCVar1 = S_bignum_cache;
  iVar2 = CVmBigNumCacheReg::alloc_mem(&S_bignum_cache->e_,(prec + 7 >> 3) * 4 + 5);
  dst = (ushort *)(pCVar1->e_).buf_;
  if (dst != (ushort *)0x0) {
    uVar3 = prec + 7 & 0xfffffffffffffff8;
    if ((iVar2 != 0) || (*dst < uVar3)) {
      *dst = (ushort)uVar3;
      compute_exp_into((char *)dst,(char *)"\x01");
    }
    return (char *)dst;
  }
  err_throw(0xca);
}

Assistant:

const char *CVmObjBigNum::cache_e(size_t prec)
{
    /* 
     *   round up the precision a bit to ensure that we don't have to
     *   repeatedly recalculate this value if we're asked for a cluster of
     *   similar precisions 
     */
    prec = (prec + 7) & ~7;

    /* get the e cache register */
    int expanded;
    char *ext = S_bignum_cache->get_e_reg(calc_alloc(prec), &expanded);

    /* if that failed, throw an error */
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* 
     *   if we didn't have to allocate more memory, and the value in the
     *   register has at least the required precision, return the cached
     *   value 
     */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* 
     *   we have reallocated the register, or we just didn't have enough
     *   precision in the old value - set the new precision 
     */
    set_prec(ext, prec);

    /* exponentiate the base of the natural logarithm to the power 1 */
    compute_exp_into(ext, get_one());

    /* return the register pointer */
    return ext;
}